

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitArrayNewFixed
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,
          ArrayNewFixed *curr)

{
  Expression *curr_00;
  bool bVar1;
  size_t sVar2;
  ExpressionList *this_00;
  ExpressionRunner<wasm::ModuleRunner> *pEVar3;
  Expression **ppEVar4;
  Literal *pLVar5;
  Literal local_120;
  Literal local_108;
  Literal local_f0;
  byte local_d5;
  uint local_d4;
  undefined1 local_d0 [4];
  Index i;
  Literals data;
  undefined1 local_88 [8];
  Field field;
  HeapType heapType;
  Expression *value;
  Iterator __end3;
  Iterator __begin3;
  ExpressionList *__range3;
  ArrayNewFixed *pAStack_20;
  Index num;
  ArrayNewFixed *curr_local;
  ExpressionRunner<wasm::ModuleRunner> *this_local;
  Flow *result;
  
  pAStack_20 = curr;
  curr_local = (ArrayNewFixed *)this;
  this_local = (ExpressionRunner<wasm::ModuleRunner> *)__return_storage_ptr__;
  sVar2 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                    (&(curr->values).
                      super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
  __range3._4_4_ = (uint)sVar2;
  if (0x2aaaaa9 < __range3._4_4_) {
    (*this->_vptr_ExpressionRunner[3])(this,"allocation failure");
  }
  __range3._0_4_ = 1;
  bVar1 = wasm::Type::operator==
                    (&(pAStack_20->super_SpecificExpression<(wasm::Expression::Id)73>).
                      super_Expression.type,(BasicType *)&__range3);
  if (bVar1) {
    this_00 = &pAStack_20->values;
    join_0x00000010_0x00000000_ =
         ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::begin
                   (&this_00->
                     super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
    _value = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::end
                       (&this_00->
                         super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>)
    ;
    while( true ) {
      bVar1 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
              operator!=((Iterator *)&__end3.index,(Iterator *)&value);
      if (!bVar1) {
        handle_unreachable("unreachable but no unreachable child",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                           ,0x778);
      }
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                operator*((Iterator *)&__end3.index);
      curr_00 = *ppEVar4;
      pEVar3 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
      visit(__return_storage_ptr__,pEVar3,curr_00);
      bVar1 = Flow::breaking(__return_storage_ptr__);
      if (bVar1) break;
      Flow::~Flow(__return_storage_ptr__);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::operator++
                ((Iterator *)&__end3.index);
    }
  }
  else {
    field._8_8_ = wasm::Type::getHeapType
                            (&(pAStack_20->super_SpecificExpression<(wasm::Expression::Id)73>).
                              super_Expression.type);
    HeapType::getArray((HeapType *)
                       &data.super_SmallVector<wasm::Literal,_1UL>.flexible.
                        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    local_88 = (undefined1  [8])
               data.super_SmallVector<wasm::Literal,_1UL>.flexible.
               super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    Literals::Literals((Literals *)local_d0,(ulong)__range3._4_4_);
    for (local_d4 = 0; local_d4 < __range3._4_4_; local_d4 = local_d4 + 1) {
      local_d5 = 0;
      pEVar3 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pAStack_20->values).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,(ulong)local_d4);
      visit(__return_storage_ptr__,pEVar3,*ppEVar4);
      bVar1 = Flow::breaking(__return_storage_ptr__);
      if (bVar1) {
        local_d5 = 1;
      }
      else {
        pLVar5 = Flow::getSingleValue(__return_storage_ptr__);
        wasm::Literal::Literal(&local_108,pLVar5);
        truncateForPacking(&local_f0,this,&local_108,(Field *)local_88);
        pLVar5 = SmallVector<wasm::Literal,_1UL>::operator[]
                           ((SmallVector<wasm::Literal,_1UL> *)local_d0,(ulong)local_d4);
        wasm::Literal::operator=(pLVar5,&local_f0);
        wasm::Literal::~Literal(&local_f0);
        wasm::Literal::~Literal(&local_108);
      }
      if ((local_d5 & 1) == 0) {
        Flow::~Flow(__return_storage_ptr__);
      }
      if (bVar1) goto LAB_0274ea30;
    }
    makeGCData(&local_120,this,(Literals *)local_d0,
               (Type)(pAStack_20->super_SpecificExpression<(wasm::Expression::Id)73>).
                     super_Expression.type.id);
    Flow::Flow(__return_storage_ptr__,&local_120);
    wasm::Literal::~Literal(&local_120);
LAB_0274ea30:
    Literals::~Literals((Literals *)local_d0);
  }
  return __return_storage_ptr__;
}

Assistant:

Flow visitArrayNewFixed(ArrayNewFixed* curr) {
    NOTE_ENTER("ArrayNewFixed");
    Index num = curr->values.size();
    if (num >= DataLimit) {
      hostLimit("allocation failure");
    }
    if (curr->type == Type::unreachable) {
      // We cannot proceed to compute the heap type, as there isn't one. Just
      // find why we are unreachable, and stop there.
      for (auto* value : curr->values) {
        auto result = self()->visit(value);
        if (result.breaking()) {
          return result;
        }
      }
      WASM_UNREACHABLE("unreachable but no unreachable child");
    }
    auto heapType = curr->type.getHeapType();
    auto field = heapType.getArray().element;
    Literals data(num);
    for (Index i = 0; i < num; i++) {
      auto value = self()->visit(curr->values[i]);
      if (value.breaking()) {
        return value;
      }
      data[i] = truncateForPacking(value.getSingleValue(), field);
    }
    return makeGCData(std::move(data), curr->type);
  }